

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O3

void __thiscall
TTD::FileWriter::WriteFormattedCharData<7ul,unsigned_int>
          (FileWriter *this,char16 (*formatString) [7],uint data)

{
  uint uVar1;
  ulong uVar2;
  size_t bufflen;
  
  bufflen = this->m_cursor;
  if (bufflen - 0x1fff80 < 0xffffffffffe00000) {
    WriteBlock(this,this->m_buffer,bufflen);
    this->m_cursor = 0;
    bufflen = 0;
  }
  uVar1 = swprintf_s((char16_t_conflict *)(this->m_buffer + bufflen),0x40,
                     (char16_t_conflict *)formatString,(ulong)data);
  if (uVar1 < 0x40) {
    uVar2 = (ulong)(uVar1 * 2) + this->m_cursor;
    if (uVar2 < 0x200000) {
      this->m_cursor = uVar2;
      return;
    }
    TTDAbort_unrecoverable_error("Must have already reserved the space!");
  }
  TTDAbort_unrecoverable_error("Formatting failed or result is too big.");
}

Assistant:

void WriteFormattedCharData(const char16(&formatString)[N], T data)
        {
            byte* trgtBuff = this->ReserveSpaceForSmallData<TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE>();

            int addedChars = swprintf_s((char16*)trgtBuff, (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), formatString, data);
            TTDAssert(addedChars != -1 && addedChars < (TTD_SERIALIZATION_MAX_FORMATTED_DATA_SIZE / sizeof(char16)), "Formatting failed or result is too big.");

            int addedBytes = (addedChars != -1) ? (addedChars * sizeof(char16)) : 0;
            this->CommitSpaceForSmallData(addedBytes);
        }